

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

bool __thiscall
ClipperLib::Clipper::JoinPoints(Clipper *this,Join *j,OutRec *outRec1,OutRec *outRec2)

{
  IntPoint *pIVar1;
  OutPt *pOVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  OutPt *pOVar7;
  OutPt *pOVar8;
  long lVar9;
  long lVar10;
  cInt cVar11;
  bool bVar12;
  IntPoint Pt;
  bool bVar13;
  bool bVar14;
  OutPt *pOVar15;
  OutPt *pOVar16;
  OutPt *pOVar17;
  OutPt *pOVar18;
  OutPt *pOVar19;
  cInt *pcVar20;
  OutPt *op2b;
  char cVar21;
  OutPt *pOVar22;
  OutPt *result;
  IntPoint IVar23;
  IntPoint pt1;
  IntPoint pt2;
  IntPoint pt2_00;
  IntPoint pt2_01;
  IntPoint pt2_02;
  IntPoint pt3;
  IntPoint pt3_00;
  IntPoint pt3_01;
  IntPoint pt3_02;
  undefined1 in_stack_ffffffffffffff8c [11];
  undefined1 in_stack_ffffffffffffff97;
  
  pOVar17 = j->OutPt1;
  pOVar2 = j->OutPt2;
  pIVar1 = &pOVar17->Pt;
  lVar3 = pIVar1->X;
  lVar4 = (pOVar17->Pt).Y;
  IVar23 = *pIVar1;
  lVar5 = (j->OffPt).Y;
  if (lVar4 != lVar5) {
    lVar6 = (pOVar17->Pt).Y;
    pOVar18 = pOVar17;
    do {
      pOVar18 = pOVar18->Next;
      lVar9 = (pOVar18->Pt).X;
      if ((pOVar18 == pOVar17) || (lVar9 != lVar3)) break;
    } while ((pOVar18->Pt).Y == lVar6);
    lVar10 = (pOVar18->Pt).Y;
    cVar21 = true;
    if (lVar10 <= lVar4) {
      pt2.Y = lVar10;
      pt2.X = lVar9;
      pt3.Y = lVar5;
      pt3.X = (j->OffPt).X;
      bVar14 = SlopesEqual(*pIVar1,pt2,pt3,
                           (bool)(this->_vptr_Clipper[-3] + 8)
                                 [(long)&(this->m_GhostJoins).
                                         super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                 ]);
      cVar21 = !bVar14;
    }
    pOVar15 = pOVar17;
    if ((bool)cVar21 != false) {
      do {
        pOVar18 = pOVar15->Prev;
        lVar9 = (pOVar18->Pt).X;
        if ((pOVar18 == pOVar17) || (lVar9 != lVar3)) break;
        pOVar15 = pOVar18;
      } while ((pOVar18->Pt).Y == lVar6);
      lVar3 = (pOVar18->Pt).Y;
      if (lVar4 < lVar3) {
        return false;
      }
      pt2_00.Y = lVar3;
      pt2_00.X = lVar9;
      pt3_00.Y = lVar5;
      pt3_00.X = (j->OffPt).X;
      bVar14 = SlopesEqual(IVar23,pt2_00,pt3_00,
                           (bool)(this->_vptr_Clipper[-3] + 8)
                                 [(long)&(this->m_GhostJoins).
                                         super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                 ]);
      if (!bVar14) {
        return false;
      }
    }
    lVar3 = (pOVar2->Pt).X;
    lVar4 = (pOVar2->Pt).Y;
    pOVar15 = pOVar2;
    do {
      pOVar15 = pOVar15->Next;
      lVar6 = (pOVar15->Pt).X;
      if ((lVar6 != lVar3) || ((pOVar15->Pt).Y != lVar4)) break;
    } while (pOVar15 != pOVar2);
    lVar9 = (pOVar15->Pt).Y;
    lVar10 = (pOVar2->Pt).Y;
    bVar14 = true;
    if (lVar9 <= lVar10) {
      IVar23.Y = lVar10;
      IVar23.X = lVar3;
      pt2_01.Y = lVar9;
      pt2_01.X = lVar6;
      pt3_01.Y = lVar5;
      pt3_01.X = (j->OffPt).X;
      bVar14 = SlopesEqual(IVar23,pt2_01,pt3_01,
                           (bool)(this->_vptr_Clipper[-3] + 8)
                                 [(long)&(this->m_GhostJoins).
                                         super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                 ]);
      bVar14 = !bVar14;
    }
    pOVar16 = pOVar2;
    if (bVar14 != false) {
      do {
        pOVar15 = pOVar16->Prev;
        lVar6 = (pOVar15->Pt).X;
        if ((lVar6 != lVar3) || ((pOVar15->Pt).Y != lVar4)) break;
        pOVar16 = pOVar15;
      } while (pOVar15 != pOVar2);
      lVar4 = (pOVar15->Pt).Y;
      if (lVar10 < lVar4) {
        return false;
      }
      pt1.Y = lVar10;
      pt1.X = lVar3;
      pt2_02.Y = lVar4;
      pt2_02.X = lVar6;
      pt3_02.Y = lVar5;
      pt3_02.X = (j->OffPt).X;
      bVar13 = SlopesEqual(pt1,pt2_02,pt3_02,
                           (bool)(this->_vptr_Clipper[-3] + 8)
                                 [(long)&(this->m_GhostJoins).
                                         super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                 ]);
      if (!bVar13) {
        return false;
      }
    }
    if (pOVar18 == pOVar15) {
      return false;
    }
    if (pOVar18 == pOVar17) {
      return false;
    }
    if (pOVar15 == pOVar2) {
      return false;
    }
    if ((outRec1 == outRec2) && (bVar14 == (bool)cVar21)) {
      return false;
    }
    pOVar18 = (OutPt *)operator_new(0x28);
    cVar11 = (pOVar17->Pt).Y;
    (pOVar18->Pt).X = (pOVar17->Pt).X;
    (pOVar18->Pt).Y = cVar11;
    pOVar18->Idx = pOVar17->Idx;
    if (cVar21 == '\0') {
      pOVar15 = pOVar17->Next;
      pOVar18->Next = pOVar15;
      pOVar18->Prev = pOVar17;
      pOVar15->Prev = pOVar18;
      pOVar17->Next = pOVar18;
      pOVar16 = (OutPt *)operator_new(0x28);
      cVar11 = (pOVar2->Pt).Y;
      (pOVar16->Pt).X = (pOVar2->Pt).X;
      (pOVar16->Pt).Y = cVar11;
      pOVar16->Idx = pOVar2->Idx;
      pOVar15 = pOVar2->Prev;
      pOVar16->Prev = pOVar15;
      pOVar16->Next = pOVar2;
      pOVar15->Next = pOVar16;
      pOVar2->Prev = pOVar16;
      pOVar17->Next = pOVar2;
      pOVar2->Prev = pOVar17;
      pOVar18->Prev = pOVar16;
      pOVar16->Next = pOVar18;
    }
    else {
      pOVar15 = pOVar17->Prev;
      pOVar18->Prev = pOVar15;
      pOVar18->Next = pOVar17;
      pOVar15->Next = pOVar18;
      pOVar17->Prev = pOVar18;
      pOVar16 = (OutPt *)operator_new(0x28);
      cVar11 = (pOVar2->Pt).Y;
      (pOVar16->Pt).X = (pOVar2->Pt).X;
      (pOVar16->Pt).Y = cVar11;
      pOVar16->Idx = pOVar2->Idx;
      pOVar15 = pOVar2->Next;
      pOVar16->Next = pOVar15;
      pOVar16->Prev = pOVar2;
      pOVar15->Prev = pOVar16;
      pOVar2->Next = pOVar16;
      pOVar17->Prev = pOVar2;
      pOVar2->Next = pOVar17;
      pOVar18->Next = pOVar16;
      pOVar16->Prev = pOVar18;
    }
    j->OutPt2 = pOVar18;
    return true;
  }
  lVar4 = (j->OffPt).X;
  pOVar18 = pOVar17;
  if ((((lVar4 == lVar3) && (lVar3 = (j->OffPt).Y, lVar3 == (pOVar17->Pt).Y)) &&
      (lVar4 == (pOVar2->Pt).X)) && (lVar3 == (pOVar2->Pt).Y)) {
    if (outRec1 != outRec2) {
      return false;
    }
    do {
      pOVar18 = pOVar18->Next;
      if ((pOVar18 == pOVar17) || ((pOVar18->Pt).X != lVar4)) break;
    } while ((pOVar18->Pt).Y == lVar3);
    lVar6 = (pOVar18->Pt).Y;
    pOVar18 = pOVar2;
    do {
      pOVar18 = pOVar18->Next;
      if ((pOVar18 == pOVar2) || ((pOVar18->Pt).X != lVar4)) break;
    } while ((pOVar18->Pt).Y == lVar3);
    bVar14 = (pOVar18->Pt).Y <= lVar5 == lVar5 < lVar6;
    if (bVar14) {
      bVar13 = lVar6 <= lVar5;
      bVar12 = lVar5 < lVar6;
      pOVar15 = (OutPt *)operator_new(0x28);
      cVar11 = (pOVar17->Pt).Y;
      (pOVar15->Pt).X = (pOVar17->Pt).X;
      (pOVar15->Pt).Y = cVar11;
      pOVar15->Idx = pOVar17->Idx;
      pOVar18 = (&pOVar17->Next)[bVar12];
      (&pOVar15->Next)[bVar12] = pOVar18;
      (&pOVar15->Next)[bVar13] = pOVar17;
      (&pOVar18->Next)[bVar13] = pOVar15;
      (&pOVar17->Next)[bVar12] = pOVar15;
      pOVar16 = (OutPt *)operator_new(0x28);
      cVar11 = (pOVar2->Pt).Y;
      (pOVar16->Pt).X = (pOVar2->Pt).X;
      (pOVar16->Pt).Y = cVar11;
      pOVar16->Idx = pOVar2->Idx;
      pOVar18 = (&pOVar2->Next)[bVar13];
      (&pOVar16->Next)[bVar13] = pOVar18;
      (&pOVar16->Next)[bVar12] = pOVar2;
      (&pOVar18->Next)[bVar12] = pOVar16;
      (&pOVar2->Next)[bVar13] = pOVar16;
      (&pOVar17->Next)[bVar12] = pOVar2;
      (&pOVar2->Next)[bVar13] = pOVar17;
      (&pOVar15->Next)[bVar13] = pOVar16;
      (&pOVar16->Next)[bVar12] = pOVar15;
      j->OutPt2 = pOVar15;
      return bVar14;
    }
    return bVar14;
  }
  do {
    pOVar15 = pOVar18;
    pOVar18 = pOVar15->Prev;
    if ((pOVar18 == pOVar17) || ((pOVar18->Pt).Y != (pOVar15->Pt).Y)) break;
  } while (pOVar18 != pOVar2);
  do {
    pOVar18 = pOVar17;
    pOVar17 = pOVar18->Next;
    if ((pOVar17 == pOVar15) || ((pOVar17->Pt).Y != (pOVar18->Pt).Y)) break;
  } while (pOVar17 != pOVar2);
  pOVar16 = pOVar2;
  if (pOVar17 == pOVar15 || pOVar17 == pOVar2) {
    return false;
  }
  do {
    pOVar17 = pOVar16;
    pOVar16 = pOVar17->Prev;
    if ((pOVar16 == pOVar18) || ((pOVar16->Pt).Y != (pOVar17->Pt).Y)) break;
  } while (pOVar16 != pOVar2);
  do {
    pOVar16 = pOVar2;
    pOVar2 = pOVar16->Next;
    if ((pOVar2 == pOVar15) || (pOVar2 == pOVar17)) break;
  } while ((pOVar2->Pt).Y == (pOVar16->Pt).Y);
  if (pOVar2 == pOVar17 || pOVar2 == pOVar15) {
    return false;
  }
  pOVar2 = (OutPt *)(pOVar15->Pt).X;
  pOVar7 = (OutPt *)(pOVar18->Pt).X;
  pOVar8 = (OutPt *)(pOVar17->Pt).X;
  op2b = (OutPt *)(pOVar16->Pt).X;
  bVar14 = (long)pOVar2 < (long)pOVar7;
  pOVar19 = pOVar8;
  if ((long)pOVar2 < (long)pOVar7) {
    pOVar22 = pOVar7;
    if ((long)pOVar8 < (long)op2b) {
      if ((long)pOVar8 < (long)pOVar2) {
        pOVar19 = pOVar2;
      }
LAB_0016c157:
      if ((long)op2b < (long)pOVar22) {
        pOVar22 = op2b;
      }
      goto LAB_0016c1db;
    }
    pOVar19 = op2b;
    if ((long)op2b < (long)pOVar2) {
      pOVar19 = pOVar2;
    }
  }
  else {
    pOVar22 = pOVar2;
    if ((long)pOVar8 < (long)op2b) {
      if ((long)pOVar8 < (long)pOVar7) {
        pOVar19 = pOVar7;
      }
      goto LAB_0016c157;
    }
    pOVar19 = op2b;
    if ((long)op2b < (long)pOVar7) {
      pOVar19 = pOVar7;
    }
  }
  if ((long)pOVar8 < (long)pOVar22) {
    pOVar22 = pOVar8;
  }
LAB_0016c1db:
  if ((long)pOVar22 <= (long)pOVar19) {
    return false;
  }
  if (((long)pOVar2 < (long)pOVar19) || ((long)pOVar22 < (long)pOVar2)) {
    if (((long)pOVar8 < (long)pOVar19) || ((long)pOVar22 < (long)pOVar8)) {
      if (((long)pOVar7 < (long)pOVar19) || ((long)pOVar22 < (long)pOVar7)) {
        pcVar20 = &(pOVar16->Pt).Y;
        bVar14 = (long)pOVar8 < (long)op2b;
      }
      else {
        pcVar20 = &(pOVar18->Pt).Y;
        op2b = pOVar7;
      }
    }
    else {
      pcVar20 = &(pOVar17->Pt).Y;
      bVar14 = (long)op2b < (long)pOVar8;
      op2b = pOVar8;
    }
  }
  else {
    pcVar20 = &(pOVar15->Pt).Y;
    bVar14 = (long)pOVar7 < (long)pOVar2;
    op2b = pOVar2;
  }
  cVar11 = *pcVar20;
  j->OutPt1 = pOVar15;
  j->OutPt2 = pOVar17;
  Pt._4_11_ = in_stack_ffffffffffffff8c;
  Pt.X._0_4_ = (uint)bVar14;
  Pt.Y._7_1_ = in_stack_ffffffffffffff97;
  bVar14 = JoinHorz((ClipperLib *)pOVar15,pOVar18,pOVar17,pOVar16,op2b,Pt,SUB81(cVar11,0));
  return bVar14;
}

Assistant:

bool Clipper::JoinPoints(Join *j, OutRec* outRec1, OutRec* outRec2)
{
  OutPt *op1 = j->OutPt1, *op1b;
  OutPt *op2 = j->OutPt2, *op2b;

  //There are 3 kinds of joins for output polygons ...
  //1. Horizontal joins where Join.OutPt1 & Join.OutPt2 are vertices anywhere
  //along (horizontal) collinear edges (& Join.OffPt is on the same horizontal).
  //2. Non-horizontal joins where Join.OutPt1 & Join.OutPt2 are at the same
  //location at the Bottom of the overlapping segment (& Join.OffPt is above).
  //3. StrictSimple joins where edges touch but are not collinear and where
  //Join.OutPt1, Join.OutPt2 & Join.OffPt all share the same point.
  bool isHorizontal = (j->OutPt1->Pt.Y == j->OffPt.Y);

  if (isHorizontal  && (j->OffPt == j->OutPt1->Pt) &&
  (j->OffPt == j->OutPt2->Pt))
  {
    //Strictly Simple join ...
    if (outRec1 != outRec2) return false;
    op1b = j->OutPt1->Next;
    while (op1b != op1 && (op1b->Pt == j->OffPt)) 
      op1b = op1b->Next;
    bool reverse1 = (op1b->Pt.Y > j->OffPt.Y);
    op2b = j->OutPt2->Next;
    while (op2b != op2 && (op2b->Pt == j->OffPt)) 
      op2b = op2b->Next;
    bool reverse2 = (op2b->Pt.Y > j->OffPt.Y);
    if (reverse1 == reverse2) return false;
    if (reverse1)
    {
      op1b = DupOutPt(op1, false);
      op2b = DupOutPt(op2, true);
      op1->Prev = op2;
      op2->Next = op1;
      op1b->Next = op2b;
      op2b->Prev = op1b;
      j->OutPt1 = op1;
      j->OutPt2 = op1b;
      return true;
    } else
    {
      op1b = DupOutPt(op1, true);
      op2b = DupOutPt(op2, false);
      op1->Next = op2;
      op2->Prev = op1;
      op1b->Prev = op2b;
      op2b->Next = op1b;
      j->OutPt1 = op1;
      j->OutPt2 = op1b;
      return true;
    }
  } 
  else if (isHorizontal)
  {
    //treat horizontal joins differently to non-horizontal joins since with
    //them we're not yet sure where the overlapping is. OutPt1.Pt & OutPt2.Pt
    //may be anywhere along the horizontal edge.
    op1b = op1;
    while (op1->Prev->Pt.Y == op1->Pt.Y && op1->Prev != op1b && op1->Prev != op2)
      op1 = op1->Prev;
    while (op1b->Next->Pt.Y == op1b->Pt.Y && op1b->Next != op1 && op1b->Next != op2)
      op1b = op1b->Next;
    if (op1b->Next == op1 || op1b->Next == op2) return false; //a flat 'polygon'

    op2b = op2;
    while (op2->Prev->Pt.Y == op2->Pt.Y && op2->Prev != op2b && op2->Prev != op1b)
      op2 = op2->Prev;
    while (op2b->Next->Pt.Y == op2b->Pt.Y && op2b->Next != op2 && op2b->Next != op1)
      op2b = op2b->Next;
    if (op2b->Next == op2 || op2b->Next == op1) return false; //a flat 'polygon'

    cInt Left, Right;
    //Op1 --> Op1b & Op2 --> Op2b are the extremites of the horizontal edges
    if (!GetOverlap(op1->Pt.X, op1b->Pt.X, op2->Pt.X, op2b->Pt.X, Left, Right))
      return false;

    //DiscardLeftSide: when overlapping edges are joined, a spike will created
    //which needs to be cleaned up. However, we don't want Op1 or Op2 caught up
    //on the discard Side as either may still be needed for other joins ...
    IntPoint Pt;
    bool DiscardLeftSide;
    if (op1->Pt.X >= Left && op1->Pt.X <= Right) 
    {
      Pt = op1->Pt; DiscardLeftSide = (op1->Pt.X > op1b->Pt.X);
    } 
    else if (op2->Pt.X >= Left&& op2->Pt.X <= Right) 
    {
      Pt = op2->Pt; DiscardLeftSide = (op2->Pt.X > op2b->Pt.X);
    } 
    else if (op1b->Pt.X >= Left && op1b->Pt.X <= Right)
    {
      Pt = op1b->Pt; DiscardLeftSide = op1b->Pt.X > op1->Pt.X;
    } 
    else
    {
      Pt = op2b->Pt; DiscardLeftSide = (op2b->Pt.X > op2->Pt.X);
    }
    j->OutPt1 = op1; j->OutPt2 = op2;
    return JoinHorz(op1, op1b, op2, op2b, Pt, DiscardLeftSide);
  } else
  {
    //nb: For non-horizontal joins ...
    //    1. Jr.OutPt1.Pt.Y == Jr.OutPt2.Pt.Y
    //    2. Jr.OutPt1.Pt > Jr.OffPt.Y

    //make sure the polygons are correctly oriented ...
    op1b = op1->Next;
    while ((op1b->Pt == op1->Pt) && (op1b != op1)) op1b = op1b->Next;
    bool Reverse1 = ((op1b->Pt.Y > op1->Pt.Y) ||
      !SlopesEqual(op1->Pt, op1b->Pt, j->OffPt, m_UseFullRange));
    if (Reverse1)
    {
      op1b = op1->Prev;
      while ((op1b->Pt == op1->Pt) && (op1b != op1)) op1b = op1b->Prev;
      if ((op1b->Pt.Y > op1->Pt.Y) ||
        !SlopesEqual(op1->Pt, op1b->Pt, j->OffPt, m_UseFullRange)) return false;
    };
    op2b = op2->Next;
    while ((op2b->Pt == op2->Pt) && (op2b != op2))op2b = op2b->Next;
    bool Reverse2 = ((op2b->Pt.Y > op2->Pt.Y) ||
      !SlopesEqual(op2->Pt, op2b->Pt, j->OffPt, m_UseFullRange));
    if (Reverse2)
    {
      op2b = op2->Prev;
      while ((op2b->Pt == op2->Pt) && (op2b != op2)) op2b = op2b->Prev;
      if ((op2b->Pt.Y > op2->Pt.Y) ||
        !SlopesEqual(op2->Pt, op2b->Pt, j->OffPt, m_UseFullRange)) return false;
    }

    if ((op1b == op1) || (op2b == op2) || (op1b == op2b) ||
      ((outRec1 == outRec2) && (Reverse1 == Reverse2))) return false;

    if (Reverse1)
    {
      op1b = DupOutPt(op1, false);
      op2b = DupOutPt(op2, true);
      op1->Prev = op2;
      op2->Next = op1;
      op1b->Next = op2b;
      op2b->Prev = op1b;
      j->OutPt1 = op1;
      j->OutPt2 = op1b;
      return true;
    } else
    {
      op1b = DupOutPt(op1, true);
      op2b = DupOutPt(op2, false);
      op1->Next = op2;
      op2->Prev = op1;
      op1b->Prev = op2b;
      op2b->Next = op1b;
      j->OutPt1 = op1;
      j->OutPt2 = op1b;
      return true;
    }
  }
}